

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thrd_join.c
# Opt level: O0

int thrd_join(thrd_t thr,int *res)

{
  int iVar1;
  undefined4 uStack_28;
  int rc;
  void *result;
  int *res_local;
  thrd_t thr_local;
  
  result = res;
  res_local = (int *)thr;
  iVar1 = pthread_join(thr,(void **)&uStack_28);
  if (result != (void *)0x0) {
    *(undefined4 *)result = uStack_28;
  }
  if (iVar1 == 0) {
    thr_local._4_4_ = 1;
  }
  else {
    thr_local._4_4_ = 3;
  }
  return thr_local._4_4_;
}

Assistant:

int thrd_join( thrd_t thr, int * res )
{
    void * result;
    int rc = pthread_join( thr, &result );

    if ( res != NULL )
    {
        *res = ( int )( uintptr_t )result;
    }

    if ( rc == 0 )
    {
        return thrd_success;
    }
    else
    {
        return thrd_error;
    }
}